

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonFunc.h
# Opt level: O2

size_t gen_random_node_by_weight_LT(Edgelist *edges)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  iVar3 = dsfmt_global_data.idx;
  if (0x17d < dsfmt_global_data.idx) {
    dsfmt_gen_rand_all(&dsfmt_global_data);
    iVar3 = 0;
  }
  dsfmt_global_data.idx = iVar3 + 1;
  dVar8 = 2.0 - dsfmt_global_data.status[0].d[iVar3];
  ppVar1 = (edges->
           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((double)ppVar1->second <= dVar8) {
    ppVar2 = (edges->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)ppVar2 - (long)ppVar1 >> 3;
    if (dVar8 <= (double)ppVar2[-1].second) {
      uVar7 = 0;
      uVar6 = lVar4 - 1;
      while (sVar5 = uVar6, uVar7 < sVar5) {
        uVar6 = uVar7 + sVar5 >> 1;
        if ((double)ppVar1[uVar6].second < dVar8) {
          uVar7 = uVar6 + 1;
          uVar6 = sVar5;
        }
      }
    }
    else {
      sVar5 = lVar4 + 1;
    }
  }
  else {
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

static inline size_t gen_random_node_by_weight_LT(const Edgelist& edges)
{
    const double weight = dsfmt_gv_genrand_open_close();
    size_t minIdx = 0, maxIdx = edges.size() - 1;
    if (weight < edges.front().second) return 0; // First element
    if (weight > edges.back().second) return edges.size() + 1; // No element
    while (maxIdx > minIdx)
    {
        const size_t meanIdx = (minIdx + maxIdx) / 2;
        const auto meanWeight = edges[meanIdx].second;
        if (weight <= meanWeight) maxIdx = meanIdx;
        else minIdx = meanIdx + 1;
    }
    return maxIdx;
}